

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O3

bool __thiscall AixLog::Filter::match(Filter *this,Metadata *metadata)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  bool local_30;
  
  if ((this->tag_filter_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar1 = true;
  }
  else {
    cVar2 = std::
            _Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
            ::find((_Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
                    *)this,&metadata->tag);
    cVar3 = cVar2;
    if ((_Rb_tree_header *)cVar2._M_node == &(this->tag_filter_)._M_t._M_impl.super__Rb_tree_header)
    {
      local_58 = (undefined1  [8])&PTR__Tag_001eaf88;
      local_50._M_p = (pointer)&local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"*","");
      local_30 = false;
      cVar3 = std::
              _Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
              ::find((_Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
                      *)this,(key_type *)local_58);
      local_58 = (undefined1  [8])&PTR__Tag_001eaf88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      if (cVar3._M_node == cVar2._M_node) {
        return false;
      }
    }
    bVar1 = *(char *)&cVar3._M_node[2]._M_left <= (char)metadata->severity;
  }
  return bVar1;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const Timestamp& timestamp) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    log->metadata_.timestamp = timestamp;
  } else if (timestamp) {
    os << timestamp.to_string();
  }
  return os;
}